

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

RefPtr<wabt::interp::Global> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
          (RefPtr<wabt::interp::Global> *__return_storage_ptr__,Store *this,Store *args,
          GlobalType *args_1,Value *args_2)

{
  Global *this_00;
  Ref ref;
  Global *local_50;
  GlobalType local_48;
  
  this_00 = (Global *)operator_new(0x68);
  local_48.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_48.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0024d200;
  local_48.mut = args_1->mut;
  local_48._12_8_ = *(undefined8 *)&(args_1->super_ExternType).field_0xc;
  Global::Global(this_00,args,&local_48,*(Value *)(args_2->field_0).v128_.v);
  local_50 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Global*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_50);
  RefPtr<wabt::interp::Global>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}